

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O3

string * __thiscall TrodesMsg::popstr_abi_cxx11_(string *__return_storage_ptr__,TrodesMsg *this)

{
  ostream *poVar1;
  char *__ptr;
  allocator local_1a;
  char local_19;
  
  if (*(this->format)._M_dataplus._M_p != 's') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error in TrodesMsg::popstr: First frame of msg not a string. Got ",0x41);
    local_19 = *(this->format)._M_dataplus._M_p;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_19,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  __ptr = zmsg_popstr(this->msg);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__ptr,&local_1a);
  free(__ptr);
  std::__cxx11::string::erase((ulong)this,1);
  return __return_storage_ptr__;
}

Assistant:

std::string TrodesMsg::popstr(){
    if(format[0] != 's') {
        std::cout << "Error in TrodesMsg::popstr: First frame of msg not a string. Got " << format[0] << std::endl;
    }
    char *str = zmsg_popstr(msg);
    std::string s(str);
    freen(str);
    format.erase(1,1);
    return s;
}